

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::AggregateInitialiserList::AggregateInitialiserList
          (AggregateInitialiserList *this,CodeLocation *l,Type *t)

{
  CodeLocation local_30;
  Type *local_20;
  Type *t_local;
  CodeLocation *l_local;
  AggregateInitialiserList *this_local;
  
  local_20 = t;
  t_local = (Type *)l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_30,l);
  Expression::Expression(&this->super_Expression,&local_30);
  CodeLocation::~CodeLocation(&local_30);
  (this->super_Expression).super_Object._vptr_Object =
       (_func_int **)&PTR__AggregateInitialiserList_0058b120;
  Type::Type(&this->type,local_20);
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::ArrayWithPreallocation
            (&this->items);
  return;
}

Assistant:

AggregateInitialiserList (CodeLocation l, const Type& t) : Expression (std::move (l)), type (t) {}